

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O0

void __thiscall qpdf::Stream::setDictDescription(Stream *this)

{
  bool bVar1;
  QPDFObjectHandle *this_00;
  element_type *peVar2;
  QPDF *owning_qpdf;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Members *local_18;
  Members *s;
  Stream *this_local;
  
  s = (Members *)this;
  local_18 = stream(this);
  bVar1 = QPDFObjectHandle::hasObjectDescription(&local_18->stream_dict);
  if (!bVar1) {
    this_00 = &local_18->stream_dict;
    peVar2 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )this);
    owning_qpdf = QPDFObject::getQPDF(peVar2);
    peVar2 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )this);
    QPDFObject::getDescription_abi_cxx11_(&local_58,peVar2);
    std::operator+(&local_38,&local_58," -> stream dictionary");
    QPDFObjectHandle::setObjectDescription(this_00,owning_qpdf,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return;
}

Assistant:

void
qpdf::Stream::setDictDescription()
{
    auto s = stream();
    if (!s->stream_dict.hasObjectDescription()) {
        s->stream_dict.setObjectDescription(
            obj->getQPDF(), obj->getDescription() + " -> stream dictionary");
    }
}